

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher.h
# Opt level: O1

bool __thiscall
cpsm::Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits>::match
          (Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits> *this,string_ref item)

{
  pointer pcVar1;
  char *pcVar2;
  bool bVar3;
  char *pcVar4;
  anon_class_8_1_a7bdc6fd *in_RCX;
  pointer pCVar5;
  string_ref str;
  Vec *local_30;
  
  pcVar1 = (this->item_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->item_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish != pcVar1) {
    (this->item_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = pcVar1;
  }
  std::vector<char,_std::allocator<char>_>::reserve(&this->item_,(size_type)item.len_);
  str.len_ = (size_t)&local_30;
  str.ptr_ = (char *)item.len_;
  local_30 = &this->item_;
  SimpleStringTraits::
  for_each_char<cpsm::decode_to<cpsm::SimpleStringTraits>(boost::basic_string_ref<char,std::char_traits<char>>,std::vector<cpsm::SimpleStringTraits::Char,std::allocator<cpsm::SimpleStringTraits::Char>>&)::_lambda(char,int,int)_1_>
            ((SimpleStringTraits *)item.ptr_,str,in_RCX);
  bVar3 = scan(this);
  if ((!bVar3) || (bVar3 = check_crfile(this), !bVar3)) {
    return false;
  }
  this->prefix_level_ = NONE;
  this->whole_basename_match_ = false;
  this->basename_longest_submatch_ = 0;
  this->basename_match_count_ = 0;
  this->basename_word_gaps_ = 0;
  if ((this->query_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_start ==
      (this->query_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_finish) {
    return true;
  }
  pcVar4 = (this->item_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar4 == (this->item_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    return true;
  }
  if ((this->case_sensitive_ == false) &&
     (pcVar2 = (this->item_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish, pcVar4 != pcVar2)) {
    pCVar5 = (this->props_).
             super__Vector_base<cpsm::Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits>::CharProperties>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (pCVar5->uppercase == true) {
        *pcVar4 = *pcVar4 + ' ';
      }
      pcVar4 = pcVar4 + 1;
      pCVar5 = pCVar5 + 1;
    } while (pcVar4 != pcVar2);
  }
  bVar3 = check_component_match_front(this);
  if (!bVar3) {
    return true;
  }
  bVar3 = check_basename_match_word_prefix(this);
  if (bVar3) {
    score_basename_word_prefix_match(this);
    return true;
  }
  score_basename_greedy(this);
  return true;
}

Assistant:

bool match(boost::string_ref const item) {
    item_.clear();
    decode_to<StringTraits>(item, item_);

    // Determine if the query matches at all.
    if (!scan()) {
      return false;
    }

    // Check for compatibility with `crfile`.
    if (!check_crfile()) {
      return false;
    }

    // Beyond this point, the item is definitely a match, and we're only
    // evaluating its quality. Reset scoring state (other than what's already
    // been assigned by `check_crfile`).
    prefix_level_ = PrefixLevel::NONE;
    whole_basename_match_ = false;
    basename_longest_submatch_ = 0;
    basename_match_count_ = 0;
    basename_word_gaps_ = 0;

    // Don't waste any time on empty queries, which can't do any further
    // differentiation between items. Also return early if the item is empty,
    // so that the remainder of the algorithm can assume it isn't.
    if (query_.empty() || item_.empty()) {
      return true;
    }

    // If the match is case-insensitive, the query must not contain any
    // uppercase letters. Convert all uppercase characters in the item to
    // lowercase so matching below this point is simply equality comparison.
    make_item_matchcase();

    // Try to constrain the match so that matches are required at the start of
    // matched path components.
    if (!check_component_match_front()) {
      // If that fails, conclude that the match is bad and don't do any further
      // matching.
      return true;
    }

    // Try to additionally constrain the match so that all matches in the
    // basename (rightmost path component) occur at the beginning of "words".
    if (check_basename_match_word_prefix()) {
      score_basename_word_prefix_match();
    } else {
      // If that fails, fall back to simple greedy matching.
      score_basename_greedy();
    }

    return true;
  }